

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_alphargbblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uint *src,int mapWidth,
               int mapHeight,int srcStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  QT_FT_Span *pQVar4;
  bool bVar5;
  QRgba64 *pQVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  QRgba64 *srcLinear;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ClipLine *pCVar17;
  long in_FS_OFFSET;
  ushort uVar18;
  ushort uVar19;
  QRgba64 buffer [2048];
  uint *local_4098;
  QColorTrcLut *local_4090;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  srcLinear = (QRgba64 *)color->rgba;
  if ((ulong)srcLinear >> 0x30 == 0) goto LAB_00654a8e;
  if (useGammaCorrection) {
    local_4090 = QGuiApplicationPrivate::colorProfileForA32Text(QGuiApplicationPrivate::self);
    srcLinear = (QRgba64 *)color->rgba;
    if (local_4090 == (QColorTrcLut *)0x0) goto LAB_00654766;
    if ((short)((ulong)srcLinear >> 0x30) == -1) {
      _Var1._M_head_impl =
           (local_4090->m_toLinear)._M_t.
           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar18 = (ushort)((ulong)srcLinear >> 0x10);
      uVar19 = (ushort)((ulong)srcLinear >> 0x20);
      srcLinear = (QRgba64 *)
                  CONCAT26(0xffff,CONCAT24((_Var1._M_head_impl
                                            [(ushort)(uVar19 - (uVar19 >> 8)) >> 4] >> 8) +
                                           _Var1._M_head_impl[(ushort)(uVar19 - (uVar19 >> 8)) >> 4]
                                           ,CONCAT22((_Var1._M_head_impl
                                                      [(ushort)(uVar18 - (uVar18 >> 8)) >> 4] >> 8)
                                                     + _Var1._M_head_impl
                                                       [(ushort)(uVar18 - (uVar18 >> 8)) >> 4],
                                                     (_Var1._M_head_impl
                                                      [(ushort)((ushort)srcLinear -
                                                               ((ushort)srcLinear >> 8)) >> 4] >> 8)
                                                     + _Var1._M_head_impl
                                                       [(ushort)((ushort)srcLinear -
                                                                ((ushort)srcLinear >> 8)) >> 4])));
    }
  }
  else {
LAB_00654766:
    local_4090 = (QColorTrcLut *)0x0;
  }
  p_Var2 = destFetchProc64[rasterBuffer->format];
  p_Var3 = destStoreProc64[rasterBuffer->format];
  if (clip == (QClipData *)0x0) {
    if (0 < mapHeight) {
      iVar9 = 0;
      local_4098 = src;
      do {
        if (0 < mapWidth) {
          iVar11 = x;
          uVar7 = mapWidth;
          do {
            uVar10 = 0x800;
            if (uVar7 < 0x800) {
              uVar10 = (ulong)uVar7;
            }
            iVar14 = (int)uVar10;
            pQVar6 = (*p_Var2)(local_4038,rasterBuffer,iVar11,y + iVar9,iVar14);
            uVar13 = 0;
            do {
              alphargbblend_generic
                        (local_4098[(long)(iVar11 - x) + uVar13],pQVar6,(int)uVar13,srcLinear,
                         (QRgba64 *)color->rgba,local_4090);
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
            if (p_Var3 != (DestStoreProc64)0x0) {
              (*p_Var3)(rasterBuffer,iVar11,y + iVar9,pQVar6,iVar14);
            }
            iVar11 = iVar11 + iVar14;
            uVar8 = uVar7 - iVar14;
            bVar5 = iVar14 <= (int)uVar7;
            uVar7 = uVar8;
          } while (uVar8 != 0 && bVar5);
        }
        iVar9 = iVar9 + 1;
        local_4098 = local_4098 + srcStride;
      } while (iVar9 != mapHeight);
    }
  }
  else {
    uVar7 = mapHeight + y;
    if (rasterBuffer->m_height <= mapHeight + y) {
      uVar7 = rasterBuffer->m_height;
    }
    uVar8 = 0;
    if (0 < y) {
      uVar8 = y;
    }
    QClipData::initialize(clip);
    if ((int)uVar8 < (int)uVar7) {
      uVar10 = (ulong)uVar8;
      local_4098 = src + ((long)(int)((uVar8 - y) * srcStride) - (long)x);
      do {
        if (0 < clip->m_clipLines[uVar10].count) {
          pCVar17 = clip->m_clipLines + uVar10;
          lVar16 = 0;
          do {
            pQVar4 = pCVar17->spans;
            iVar9 = pQVar4[lVar16].x;
            iVar11 = x;
            if (x < iVar9) {
              iVar11 = iVar9;
            }
            iVar14 = pQVar4[lVar16].len + iVar9;
            if (mapWidth + x < iVar14) {
              iVar14 = mapWidth + x;
            }
            iVar15 = iVar14 - iVar11;
            if (iVar15 != 0 && iVar11 <= iVar14) {
              pQVar6 = (*p_Var2)(local_4038,rasterBuffer,iVar11,pQVar4[lVar16].y,iVar15);
              if (iVar9 <= x) {
                iVar9 = x;
              }
              lVar12 = 0;
              do {
                alphargbblend_generic
                          (local_4098[iVar9 + lVar12],pQVar6,(int)lVar12,srcLinear,
                           (QRgba64 *)color->rgba,local_4090);
                lVar12 = lVar12 + 1;
              } while (iVar14 - iVar9 != (int)lVar12);
              if (p_Var3 != (DestStoreProc64)0x0) {
                (*p_Var3)(rasterBuffer,iVar11,pQVar4[lVar16].y,pQVar6,iVar15);
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < pCVar17->count);
        }
        uVar10 = uVar10 + 1;
        local_4098 = local_4098 + srcStride;
      } while (uVar10 != uVar7);
    }
  }
LAB_00654a8e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphargbblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uint *src, int mapWidth, int mapHeight, int srcStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA32Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                for (int j=0; j < l; ++j) {
                    const uint coverage = src[j + (i - x)];
                    alphargbblend_generic(coverage, dest, j, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            src += srcStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        src += (top - y) * srcStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);

                for (int xp=start; xp<end; ++xp) {
                    const uint coverage = src[xp - x];
                    alphargbblend_generic(coverage, dest, xp - start, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            src += srcStride;
        } // for (yp -> bottom)
    }
}